

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O1

void __thiscall DActiveButton::Tick(DActiveButton *this)

{
  DWORD *pDVar1;
  FSwitchDef *pFVar2;
  bool bVar3;
  FSwitchDef *pFVar4;
  FSoundID local_2c;
  DVector3 local_28;
  
  pFVar2 = this->m_SwitchDef;
  if (pFVar2 != (FSwitchDef *)0x0) {
    pFVar4 = pFVar2;
    if (this->bReturning == true) {
      pFVar4 = pFVar2->PairDef;
    }
    pDVar1 = &this->m_Timer;
    *pDVar1 = *pDVar1 - 1;
    if (*pDVar1 != 0) {
      return;
    }
    if (this->m_Frame == pFVar4->NumFrames - 1) {
      this->bReturning = true;
      pFVar4 = pFVar2->PairDef;
      if (pFVar4 == (FSwitchDef *)0x0) goto LAB_0045880e;
      this->m_Frame = -1;
      local_28.X = (this->m_Pos).X;
      local_28.Y = (this->m_Pos).Y;
      local_28.Z = 0.0;
      local_2c.ID = pFVar4->Sound;
      if (local_2c.ID == 0) {
        local_2c.ID = S_FindSound("switches/normbutn");
      }
      S_Sound(&local_28,10,&local_2c,1.0,3.0);
      this->bFlippable = false;
    }
    bVar3 = AdvanceFrame(this);
    this->m_Side->textures[this->m_Part].texture.texnum =
         pFVar4->frames[this->m_Frame].Texture.texnum;
    if (!bVar3) {
      return;
    }
  }
LAB_0045880e:
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void DActiveButton::Tick ()
{
	if (m_SwitchDef == NULL)
	{
		// We lost our definition due to a bad savegame.
		Destroy();
		return;
	}

	FSwitchDef *def = bReturning? m_SwitchDef->PairDef : m_SwitchDef;
	if (--m_Timer == 0)
	{
		if (m_Frame == def->NumFrames - 1)
		{
			bReturning = true;
			def = m_SwitchDef->PairDef;
			if (def != NULL)
			{
				m_Frame = -1;
				S_Sound (DVector3(m_Pos, 0), CHAN_VOICE|CHAN_LISTENERZ,
					def->Sound != 0 ? FSoundID(def->Sound) : FSoundID("switches/normbutn"),
					1, ATTN_STATIC);
				bFlippable = false;
			}
			else
			{
				Destroy ();
				return;
			}
		}
		bool killme = AdvanceFrame ();

		m_Side->SetTexture(m_Part, def->frames[m_Frame].Texture);

		if (killme)
		{
			Destroy ();
		}
	}
}